

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

void ClearRectangle(WebPPicture *picture,int left,int top,int width,int height)

{
  int iVar1;
  uint32_t *puVar2;
  int i;
  uint32_t *dst;
  int j;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  WebPPicture *picture_local;
  
  for (j = top; j < top + height; j = j + 1) {
    puVar2 = picture->argb;
    iVar1 = picture->argb_stride;
    for (i = left; i < left + width; i = i + 1) {
      puVar2[(long)(j * iVar1) + (long)i] = 0;
    }
  }
  return;
}

Assistant:

static void ClearRectangle(WebPPicture* const picture,
                           int left, int top, int width, int height) {
  int j;
  for (j = top; j < top + height; ++j) {
    uint32_t* const dst = picture->argb + j * picture->argb_stride;
    int i;
    for (i = left; i < left + width; ++i) {
      dst[i] = TRANSPARENT_COLOR;
    }
  }
}